

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O3

void __thiscall
TEST_MemoryLeakWarningThreadSafe_turnOnThreadSafeMallocFreeReallocOverloadsDebug_Test::testBody
          (TEST_MemoryLeakWarningThreadSafe_turnOnThreadSafeMallocFreeReallocOverloadsDebug_Test
           *this)

{
  int iVar1;
  MemoryLeakDetector *pMVar2;
  size_t sVar3;
  void *pvVar4;
  UtestShell *pUVar5;
  size_t sVar6;
  TestTerminator *pTVar7;
  char *pcVar8;
  char *pcVar9;
  SimpleString local_50;
  SimpleString local_40;
  
  pMVar2 = MemoryLeakWarningPlugin::getGlobalDetector();
  sVar3 = MemoryLeakDetector::totalMemoryLeaks(pMVar2,mem_leak_period_all);
  MemoryLeakWarningPlugin::turnOnThreadSafeNewDeleteOverloads();
  pvVar4 = cpputest_malloc(4);
  pUVar5 = UtestShell::getCurrent();
  pMVar2 = MemoryLeakWarningPlugin::getGlobalDetector();
  sVar6 = MemoryLeakDetector::totalMemoryLeaks(pMVar2,mem_leak_period_all);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,sVar3 + 1,sVar6,
             "LONGS_EQUAL(storedAmountOfLeaks + 1, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x1b0,pTVar7);
  iVar1 = mutexLockCount;
  pUVar5 = UtestShell::getCurrent();
  if (iVar1 == 1) {
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1b1,pTVar7);
  }
  else {
    StringFrom((int)&local_40);
    pcVar8 = SimpleString::asCharString(&local_40);
    StringFrom((int)&local_50);
    pcVar9 = SimpleString::asCharString(&local_50);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar8,pcVar9,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1b1,pTVar7);
    SimpleString::~SimpleString(&local_50);
    SimpleString::~SimpleString(&local_40);
  }
  iVar1 = mutexUnlockCount;
  pUVar5 = UtestShell::getCurrent();
  if (iVar1 == 1) {
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1b2,pTVar7);
  }
  else {
    StringFrom((int)&local_40);
    pcVar8 = SimpleString::asCharString(&local_40);
    StringFrom((int)&local_50);
    pcVar9 = SimpleString::asCharString(&local_50);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar8,pcVar9,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1b2,pTVar7);
    SimpleString::~SimpleString(&local_50);
    SimpleString::~SimpleString(&local_40);
  }
  pvVar4 = cpputest_realloc(pvVar4,0xc);
  pUVar5 = UtestShell::getCurrent();
  pMVar2 = MemoryLeakWarningPlugin::getGlobalDetector();
  sVar6 = MemoryLeakDetector::totalMemoryLeaks(pMVar2,mem_leak_period_all);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,sVar3 + 1,sVar6,
             "LONGS_EQUAL(storedAmountOfLeaks + 1, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x1b6,pTVar7);
  iVar1 = mutexLockCount;
  pUVar5 = UtestShell::getCurrent();
  if (iVar1 == 2) {
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1b7,pTVar7);
  }
  else {
    StringFrom((int)&local_40);
    pcVar8 = SimpleString::asCharString(&local_40);
    StringFrom((int)&local_50);
    pcVar9 = SimpleString::asCharString(&local_50);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar8,pcVar9,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1b7,pTVar7);
    SimpleString::~SimpleString(&local_50);
    SimpleString::~SimpleString(&local_40);
  }
  iVar1 = mutexUnlockCount;
  pUVar5 = UtestShell::getCurrent();
  if (iVar1 == 2) {
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1b8,pTVar7);
  }
  else {
    StringFrom((int)&local_40);
    pcVar8 = SimpleString::asCharString(&local_40);
    StringFrom((int)&local_50);
    pcVar9 = SimpleString::asCharString(&local_50);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar8,pcVar9,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1b8,pTVar7);
    SimpleString::~SimpleString(&local_50);
    SimpleString::~SimpleString(&local_40);
  }
  cpputest_free(pvVar4);
  pUVar5 = UtestShell::getCurrent();
  pMVar2 = MemoryLeakWarningPlugin::getGlobalDetector();
  sVar6 = MemoryLeakDetector::totalMemoryLeaks(pMVar2,mem_leak_period_all);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,sVar3,sVar6,
             "LONGS_EQUAL(storedAmountOfLeaks, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x1bc,pTVar7);
  iVar1 = mutexLockCount;
  pUVar5 = UtestShell::getCurrent();
  if (iVar1 == 3) {
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1bd,pTVar7);
  }
  else {
    StringFrom((int)&local_40);
    pcVar8 = SimpleString::asCharString(&local_40);
    StringFrom((int)&local_50);
    pcVar9 = SimpleString::asCharString(&local_50);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar8,pcVar9,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1bd,pTVar7);
    SimpleString::~SimpleString(&local_50);
    SimpleString::~SimpleString(&local_40);
  }
  iVar1 = mutexUnlockCount;
  pUVar5 = UtestShell::getCurrent();
  if (iVar1 == 3) {
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1be,pTVar7);
  }
  else {
    StringFrom((int)&local_40);
    pcVar8 = SimpleString::asCharString(&local_40);
    StringFrom((int)&local_50);
    pcVar9 = SimpleString::asCharString(&local_50);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar8,pcVar9,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1be,pTVar7);
    SimpleString::~SimpleString(&local_50);
    SimpleString::~SimpleString(&local_40);
  }
  MemoryLeakWarningPlugin::turnOnDefaultNotThreadSafeNewDeleteOverloads();
  return;
}

Assistant:

TEST(MemoryLeakWarningThreadSafe, turnOnThreadSafeMallocFreeReallocOverloadsDebug)
{
    size_t storedAmountOfLeaks = MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all);

    MemoryLeakWarningPlugin::turnOnThreadSafeNewDeleteOverloads();

    int *n = (int*) cpputest_malloc(sizeof(int));

    LONGS_EQUAL(storedAmountOfLeaks + 1, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all));
    CHECK_EQUAL(1, mutexLockCount);
    CHECK_EQUAL(1, mutexUnlockCount);

    n = (int*) cpputest_realloc(n, sizeof(int)*3);

    LONGS_EQUAL(storedAmountOfLeaks + 1, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all));
    CHECK_EQUAL(2, mutexLockCount);
    CHECK_EQUAL(2, mutexUnlockCount);

    cpputest_free(n);

    LONGS_EQUAL(storedAmountOfLeaks, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all));
    CHECK_EQUAL(3, mutexLockCount);
    CHECK_EQUAL(3, mutexUnlockCount);

    MemoryLeakWarningPlugin::turnOnDefaultNotThreadSafeNewDeleteOverloads();
}